

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O1

void __thiscall
Assimp::FindDegeneratesProcess::Execute(FindDegeneratesProcess *this,aiScene *pScene)

{
  aiMesh *this_00;
  bool bVar1;
  uint uVar2;
  Logger *pLVar3;
  uint index;
  ulong uVar5;
  ulong uVar4;
  
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"FindDegeneratesProcess begin");
  if (pScene->mNumMeshes != 0) {
    index = 0;
    do {
      uVar5 = (ulong)index;
      if (pScene->mMeshes[uVar5]->mPrimitiveTypes != 1) {
        bVar1 = ExecuteOnMesh(this,pScene->mMeshes[uVar5]);
        if (bVar1) {
          this_00 = pScene->mMeshes[uVar5];
          uVar2 = pScene->mNumMeshes - 1;
          uVar4 = (ulong)uVar2;
          if (index < uVar2) {
            do {
              pScene->mMeshes[uVar5] = pScene->mMeshes[uVar5 + 1];
              uVar5 = uVar5 + 1;
              uVar4 = (ulong)(pScene->mNumMeshes - 1);
            } while (uVar5 < uVar4);
          }
          pScene->mMeshes[uVar4] = (aiMesh *)0x0;
          pScene->mNumMeshes = pScene->mNumMeshes - 1;
          if (this_00 != (aiMesh *)0x0) {
            aiMesh::~aiMesh(this_00);
            operator_delete(this_00);
          }
          updateSceneGraph(pScene->mRootNode,index);
          index = index - 1;
        }
      }
      index = index + 1;
    } while (index < pScene->mNumMeshes);
  }
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"FindDegeneratesProcess finished");
  return;
}

Assistant:

void FindDegeneratesProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("FindDegeneratesProcess begin");
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
    {
        //Do not process point cloud, ExecuteOnMesh works only with faces data
        if ((pScene->mMeshes[i]->mPrimitiveTypes != aiPrimitiveType::aiPrimitiveType_POINT) && ExecuteOnMesh(pScene->mMeshes[i])) {
            removeMesh(pScene, i);
            --i; //the current i is removed, do not skip the next one
        }
    }
    ASSIMP_LOG_DEBUG("FindDegeneratesProcess finished");
}